

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sfp.c
# Opt level: O2

int csp_sfp_recv_fp(csp_conn_t *conn,void **return_data,int *return_datasize,uint32_t timeout,
                   csp_packet_t *first_packet)

{
  size_t __n;
  uint uVar1;
  void *__ptr;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  *return_data = (void *)0x0;
  *return_datasize = 0;
  if ((first_packet == (csp_packet_t *)0x0) &&
     (first_packet = csp_read(conn,timeout), first_packet == (csp_packet_t *)0x0)) {
    return -3;
  }
  __ptr = (void *)0x0;
  uVar6 = 0;
  uVar1 = 0;
  do {
    if ((((first_packet->id).flags & 0x10) == 0) || (uVar2 = (ulong)first_packet->length, uVar2 < 8)
       ) {
LAB_00109646:
      iVar5 = -0x67;
LAB_00109648:
      csp_buffer_free(first_packet);
      goto LAB_00109651;
    }
    __n = uVar2 - 8;
    first_packet->length = (uint16_t)__n;
    uVar3 = *(uint *)(first_packet->header + uVar2);
    uVar4 = *(uint *)(first_packet->header + uVar2 + 4);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    *(uint *)(first_packet->header + uVar2) = uVar3;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    *(uint *)(first_packet->header + uVar2 + 4) = uVar4;
    if ((uVar4 < uVar3) || (uVar3 != uVar6)) goto LAB_00109646;
    if ((__ptr == (void *)0x0) &&
       (__ptr = malloc((ulong)uVar4), uVar1 = uVar4, __ptr == (void *)0x0)) {
      __ptr = (void *)0x0;
      iVar5 = -1;
      goto LAB_00109648;
    }
    if ((uVar1 < (int)__n + uVar6) || (uVar1 != uVar4)) goto LAB_00109646;
    memcpy((void *)((ulong)uVar6 + (long)__ptr),&first_packet->field_12,__n);
    uVar6 = uVar6 + first_packet->length;
    if (uVar4 <= uVar6) {
      csp_buffer_free(first_packet);
      *return_data = __ptr;
      *return_datasize = uVar4;
      return 0;
    }
    if (first_packet->length == 0) goto LAB_00109646;
    csp_buffer_free(first_packet);
    first_packet = csp_read(conn,timeout);
    uVar1 = uVar4;
  } while (first_packet != (csp_packet_t *)0x0);
  iVar5 = -3;
LAB_00109651:
  free(__ptr);
  return iVar5;
}

Assistant:

int csp_sfp_recv_fp(csp_conn_t * conn, void ** return_data, int * return_datasize, uint32_t timeout, csp_packet_t * first_packet) {

	*return_data = NULL; /* Allow caller to assume csp_free() can always be called when dataout is non-NULL */
	*return_datasize = 0;

	/* Get first packet from user, or from connection */
	csp_packet_t * packet;
	if (first_packet == NULL) {
		packet = csp_read(conn, timeout);
		if (packet == NULL) {
			return CSP_ERR_TIMEDOUT;
		}
	} else {
		packet = first_packet;
	}

	uint8_t * data = NULL;
	uint32_t datasize = 0;
	uint32_t data_offset = 0;
	int error = CSP_ERR_TIMEDOUT;
	do {
		/* Read SFP header */
		sfp_header_t * sfp_header = csp_sfp_header_remove(packet);
		if (sfp_header == NULL) {
			//csp_print("%s: %u:%u, invalid message, id.flags: 0x%x, length: %u\n", __func__, packet->id.src, packet->id.sport, packet->id.flags, packet->length);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		//csp_print("%s: %u:%u, fragment %" PRIu32 "/%" PRIu32 "\n",  __func__, packet->id.src, packet->id.sport, sfp_header->offset + packet->length, sfp_header->totalsize);

		/* Consistency check */
		if (sfp_header->offset != data_offset) {
			//csp_print("%s: %u:%u, invalid message, offset %" PRIu32 " (expected %" PRIu32 "), length: %u, totalsize %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, data_offset, packet->length, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Allocate memory */
		if (data == NULL) {
			datasize = sfp_header->totalsize;
			data = malloc(datasize);
			if (data == NULL) {
				//csp_print("%s: %u:%u, malloc(%" PRIu32 ") failed\n", __func__, packet->id.src, packet->id.sport, datasize);
				csp_buffer_free(packet);

				error = CSP_ERR_NOMEM;
				goto error;
			}
		}

		/* Consistency check */
		if (((data_offset + packet->length) > datasize) || (datasize != sfp_header->totalsize)) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		/* Copy data to output */
		memcpy(data + data_offset, packet->data, packet->length);
		data_offset += packet->length;

		if (data_offset >= datasize) {
			// transfer complete
			csp_buffer_free(packet);

			*return_data = data;  // must be freed by csp_free()
			*return_datasize = datasize;
			return CSP_ERR_NONE;
		}

		/* Consistency check */
		if (packet->length == 0) {
			//csp_print("%s: %u:%u, invalid size, sfp.offset: %" PRIu32 ", length: %u, total: %" PRIu32 " / %" PRIu32 "\n", __func__, packet->id.src, packet->id.sport, sfp_header->offset, packet->length, datasize, sfp_header->totalsize);
			csp_buffer_free(packet);

			error = CSP_ERR_SFP;
			goto error;
		}

		csp_buffer_free(packet);

	} while ((packet = csp_read(conn, timeout)) != NULL);

error:
	free(data);
	return error;
}